

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::Matchers::WithinRelMatcher::WithinRelMatcher
          (WithinRelMatcher *this,double target,double epsilon)

{
  undefined8 *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  ReusableStringStream *in_stack_ffffffffffffff58;
  ReusableStringStream *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff80;
  
  MatcherBase<double>::MatcherBase((MatcherBase<double> *)in_stack_ffffffffffffff60);
  *in_RDI = &PTR__WithinRelMatcher_002a6578;
  in_RDI[5] = in_XMM0_Qa;
  in_RDI[6] = CONCAT44(in_XMM1_Db,in_XMM1_Da);
  if ((double)in_RDI[6] < 0.0) {
    ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffff60);
    ReusableStringStream::operator<<
              (in_stack_ffffffffffffff60,(char (*) [59])in_stack_ffffffffffffff58);
    ReusableStringStream::str_abi_cxx11_(in_stack_ffffffffffffff58);
    throw_domain_error(in_stack_ffffffffffffff80);
  }
  if (1.0 < (double)in_RDI[6] || (double)in_RDI[6] == 1.0) {
    ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffff60);
    ReusableStringStream::operator<<
              (in_stack_ffffffffffffff60,(char (*) [59])in_stack_ffffffffffffff58);
    ReusableStringStream::str_abi_cxx11_(in_stack_ffffffffffffff58);
    throw_domain_error(in_stack_ffffffffffffff80);
  }
  return;
}

Assistant:

WithinRelMatcher::WithinRelMatcher(double target, double epsilon):
        m_target(target),
        m_epsilon(epsilon){
        CATCH_ENFORCE(m_epsilon >= 0., "Relative comparison with epsilon <  0 does not make sense.");
        CATCH_ENFORCE(m_epsilon  < 1., "Relative comparison with epsilon >= 1 does not make sense.");
    }